

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptSymbol::GetDiagValueString
          (JavascriptSymbol *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  PropertyRecord *pPVar1;
  
  if ((this->propertyRecordUsageCache).propertyRecord.ptr != (PropertyRecord *)0x0) {
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<8ul>
              (stringBuilder,(char16 (*) [8])L"Symbol(");
    pPVar1 = (this->propertyRecordUsageCache).propertyRecord.ptr;
    StringBuilder<Memory::ArenaAllocator>::Append
              (stringBuilder,(char16 *)(pPVar1 + 1),pPVar1->byteCount >> 1);
    StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L')');
  }
  return 1;
}

Assistant:

BOOL JavascriptSymbol::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        if (this->GetValue())
        {
            stringBuilder->AppendCppLiteral(_u("Symbol("));
            stringBuilder->Append(this->GetValue()->GetBuffer(), this->GetValue()->GetLength());
            stringBuilder->Append(_u(')'));
        }
        return TRUE;
    }